

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O0

void ngx_time_update(void)

{
  ngx_uint_t nVar1;
  undefined4 uVar2;
  ngx_uint_t nVar3;
  u_char (*buf) [30];
  u_char (*buf_00) [20];
  u_char (*buf_01) [27];
  u_char (*buf_02) [26];
  u_char (*buf_03) [16];
  long local_160;
  long local_150;
  long local_120;
  long local_110;
  undefined1 local_d8 [8];
  timeval tv;
  ngx_time_t *tp;
  ngx_uint_t msec;
  time_t sec;
  ngx_tm_t gmt;
  ngx_tm_t tm;
  u_char *p4;
  u_char *p3;
  u_char *p2;
  u_char *p1;
  u_char *p0;
  
  if (ngx_time_lock == 0) {
    LOCK();
    ngx_time_lock = 1;
    UNLOCK();
    gettimeofday((timeval *)local_d8,(__timezone_ptr_t)0x0);
    nVar3 = tv.tv_sec / 1000;
    ngx_current_msec = (long)local_d8 * 1000 + nVar3;
    if ((undefined1  [8])cached_time[slot].sec == local_d8) {
      cached_time[slot].msec = nVar3;
      ngx_time_lock = 0;
    }
    else {
      if (slot == 0x3f) {
        slot = 0;
      }
      else {
        slot = slot + 1;
      }
      nVar1 = slot;
      tv.tv_usec = (__suseconds_t)(cached_time + slot);
      ((ngx_time_t *)tv.tv_usec)->sec = (time_t)local_d8;
      cached_time[nVar1].msec = nVar3;
      ngx_gmtime((time_t)local_d8,(ngx_tm_t *)&sec);
      buf = cached_http_time + slot;
      ngx_sprintf(*buf,"%s, %02d %s %4d %02d:%02d:%02d GMT",week[gmt.tm_mon],(ulong)(uint)gmt.tm_min
                  ,months[gmt.tm_hour + -1],(ulong)(uint)gmt.tm_mday,gmt.tm_sec,sec._4_4_,
                  (undefined4)sec);
      ngx_localtime((time_t)local_d8,(ngx_tm_t *)&gmt.tm_zone);
      cached_gmtoff = (long)tm._32_8_ / 0x3c;
      *(ngx_int_t *)(tv.tv_usec + 0x10) = cached_gmtoff;
      buf_00 = cached_err_log_time + slot;
      ngx_sprintf(*buf_00,"%4d/%02d/%02d %02d:%02d:%02d",(ulong)(uint)tm.tm_mday,
                  (ulong)(uint)tm.tm_hour,(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,
                  gmt.tm_zone._4_4_,gmt.tm_zone._0_4_);
      buf_01 = cached_http_log_time + slot;
      uVar2 = 0x2b;
      if (*(long *)(tv.tv_usec + 0x10) < 0) {
        uVar2 = 0x2d;
      }
      if (*(long *)(tv.tv_usec + 0x10) / 0x3c < 0) {
        local_110 = -(*(long *)(tv.tv_usec + 0x10) / 0x3c);
      }
      else {
        local_110 = *(long *)(tv.tv_usec + 0x10) / 0x3c;
      }
      if (*(long *)(tv.tv_usec + 0x10) % 0x3c < 0) {
        local_120 = -(*(long *)(tv.tv_usec + 0x10) % 0x3c);
      }
      else {
        local_120 = *(long *)(tv.tv_usec + 0x10) % 0x3c;
      }
      ngx_sprintf(*buf_01,"%02d/%s/%d:%02d:%02d:%02d %c%02i%02i",(ulong)(uint)tm.tm_min,
                  months[tm.tm_hour + -1],(ulong)(uint)tm.tm_mday,(ulong)(uint)tm.tm_sec,
                  gmt.tm_zone._4_4_,gmt.tm_zone._0_4_,uVar2,local_110,local_120);
      buf_02 = cached_http_log_iso8601 + slot;
      uVar2 = 0x2b;
      if (*(long *)(tv.tv_usec + 0x10) < 0) {
        uVar2 = 0x2d;
      }
      if (*(long *)(tv.tv_usec + 0x10) / 0x3c < 0) {
        local_150 = -(*(long *)(tv.tv_usec + 0x10) / 0x3c);
      }
      else {
        local_150 = *(long *)(tv.tv_usec + 0x10) / 0x3c;
      }
      if (*(long *)(tv.tv_usec + 0x10) % 0x3c < 0) {
        local_160 = -(*(long *)(tv.tv_usec + 0x10) % 0x3c);
      }
      else {
        local_160 = *(long *)(tv.tv_usec + 0x10) % 0x3c;
      }
      ngx_sprintf(*buf_02,"%4d-%02d-%02dT%02d:%02d:%02d%c%02i:%02i",(ulong)(uint)tm.tm_mday,
                  (ulong)(uint)tm.tm_hour,(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,
                  gmt.tm_zone._4_4_,gmt.tm_zone._0_4_,uVar2,local_150,local_160);
      buf_03 = cached_syslog_time + slot;
      ngx_sprintf(*buf_03,"%s %2d %02d:%02d:%02d",months[tm.tm_hour + -1],(ulong)(uint)tm.tm_min,
                  (ulong)(uint)tm.tm_sec,(ulong)gmt.tm_zone._4_4_,gmt.tm_zone._0_4_);
      ngx_cached_time = (ngx_time_t *)tv.tv_usec;
      ngx_time_lock = 0;
      ngx_cached_err_log_time.data = *buf_00;
      ngx_cached_http_time.data = *buf;
      ngx_cached_http_log_time.data = *buf_01;
      ngx_cached_http_log_iso8601.data = *buf_02;
      ngx_cached_syslog_time.data = *buf_03;
    }
  }
  return;
}

Assistant:

void
ngx_time_update(void)
{
    u_char          *p0, *p1, *p2, *p3, *p4;
    ngx_tm_t         tm, gmt;
    time_t           sec;
    ngx_uint_t       msec;
    ngx_time_t      *tp;
    struct timeval   tv;

    if (!ngx_trylock(&ngx_time_lock)) {
        return;
    }

    ngx_gettimeofday(&tv);

    sec = tv.tv_sec;
    msec = tv.tv_usec / 1000;

    ngx_current_msec = (ngx_msec_t) sec * 1000 + msec;

    tp = &cached_time[slot];

    if (tp->sec == sec) {
        tp->msec = msec;
        ngx_unlock(&ngx_time_lock);
        return;
    }

    if (slot == NGX_TIME_SLOTS - 1) {
        slot = 0;
    } else {
        slot++;
    }

    tp = &cached_time[slot];

    tp->sec = sec;
    tp->msec = msec;

    ngx_gmtime(sec, &gmt);


    p0 = &cached_http_time[slot][0];

    (void) ngx_sprintf(p0, "%s, %02d %s %4d %02d:%02d:%02d GMT",
                       week[gmt.ngx_tm_wday], gmt.ngx_tm_mday,
                       months[gmt.ngx_tm_mon - 1], gmt.ngx_tm_year,
                       gmt.ngx_tm_hour, gmt.ngx_tm_min, gmt.ngx_tm_sec);

#if (NGX_HAVE_GETTIMEZONE)

    tp->gmtoff = ngx_gettimezone();
    ngx_gmtime(sec + tp->gmtoff * 60, &tm);

#elif (NGX_HAVE_GMTOFF)

    ngx_localtime(sec, &tm);
    cached_gmtoff = (ngx_int_t) (tm.ngx_tm_gmtoff / 60);
    tp->gmtoff = cached_gmtoff;

#else

    ngx_localtime(sec, &tm);
    cached_gmtoff = ngx_timezone(tm.ngx_tm_isdst);
    tp->gmtoff = cached_gmtoff;

#endif


    p1 = &cached_err_log_time[slot][0];

    (void) ngx_sprintf(p1, "%4d/%02d/%02d %02d:%02d:%02d",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec);


    p2 = &cached_http_log_time[slot][0];

    (void) ngx_sprintf(p2, "%02d/%s/%d:%02d:%02d:%02d %c%02i%02i",
                       tm.ngx_tm_mday, months[tm.ngx_tm_mon - 1],
                       tm.ngx_tm_year, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec,
                       tp->gmtoff < 0 ? '-' : '+',
                       ngx_abs(tp->gmtoff / 60), ngx_abs(tp->gmtoff % 60));

    p3 = &cached_http_log_iso8601[slot][0];

    (void) ngx_sprintf(p3, "%4d-%02d-%02dT%02d:%02d:%02d%c%02i:%02i",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec,
                       tp->gmtoff < 0 ? '-' : '+',
                       ngx_abs(tp->gmtoff / 60), ngx_abs(tp->gmtoff % 60));

    p4 = &cached_syslog_time[slot][0];

    (void) ngx_sprintf(p4, "%s %2d %02d:%02d:%02d",
                       months[tm.ngx_tm_mon - 1], tm.ngx_tm_mday,
                       tm.ngx_tm_hour, tm.ngx_tm_min, tm.ngx_tm_sec);

    ngx_memory_barrier();

    ngx_cached_time = tp;
    ngx_cached_http_time.data = p0;
    ngx_cached_err_log_time.data = p1;
    ngx_cached_http_log_time.data = p2;
    ngx_cached_http_log_iso8601.data = p3;
    ngx_cached_syslog_time.data = p4;

    ngx_unlock(&ngx_time_lock);
}